

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O1

bool google::protobuf::compiler::java::anon_unknown_16::BitfieldTracksMutability
               (FieldDescriptor *descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDescriptor FVar2;
  undefined1 uVar3;
  size_type sVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined8 in_RAX;
  string *this;
  long lVar10;
  FieldDescriptor *pFVar11;
  ImmutableFieldGenerator *pIVar12;
  size_type sVar13;
  uint *puVar14;
  bool bVar15;
  ulong uVar16;
  uint extraout_EDX;
  int index;
  int index_00;
  int index_01;
  int index_02;
  undefined1 *puVar17;
  int iVar18;
  iterator iVar19;
  string_view text;
  string_view text_00;
  const_iterator other;
  string_view text_01;
  string_view text_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_e0;
  string sStack_c0;
  string sStack_a0;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *pFStack_70;
  string sStack_68;
  FieldDescriptor *pFStack_48;
  undefined1 auStack_18 [16];
  
  puVar17 = auStack_18;
  FVar2 = descriptor[1];
  uVar16 = CONCAT71((int7)((ulong)in_RAX >> 8),FVar2) & 0xffffff20;
  bVar15 = (bool)((byte)uVar16 >> 5);
  index_02 = (int)CONCAT71((int7)(uVar16 >> 8),bVar15);
  if (0xbf < (byte)FVar2 == bVar15) {
    this = (string *)0x0;
  }
  else {
    this = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                     (bVar15,0xbf < (byte)FVar2,"is_repeated_ == label() == LABEL_REPEATED");
  }
  if (this != (string *)0x0) {
    _GLOBAL__N_1::BitfieldTracksMutability();
    pFStack_48 = descriptor;
    ClassNameResolver::GetClassName_abi_cxx11_
              (&sStack_c0,*(ClassNameResolver **)(puVar17 + 0x18),*(Descriptor **)(puVar17 + 8),true
              );
    paVar1 = &sStack_a0.field_2;
    lVar10 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                       (extraout_EDX,paVar1->_M_local_buf);
    sStack_a0._M_dataplus._M_p = (pointer)(lVar10 - (long)paVar1);
    bStack_e0._M_dataplus._M_p = (pointer)&bStack_e0.field_2;
    sStack_a0._M_string_length = (size_type)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&bStack_e0,paVar1,lVar10);
    GetBitFieldName_abi_cxx11_(&sStack_68,(java *)(ulong)extraout_EDX,index);
    text._M_str = 
    "private void buildPartial$piece$($classname$ result) {\n  int from_$bit_field_name$ = $bit_field_name$;\n"
    ;
    text._M_len = 0x67;
    io::Printer::
    Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string,char[15],std::__cxx11::string>
              ((Printer *)this,text,(char (*) [10])0x4712c9,&sStack_c0,(char (*) [6])"piece",
               &bStack_e0,(char (*) [15])"bit_field_name",&sStack_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_68._M_dataplus._M_p != &sStack_68.field_2) {
      operator_delete(sStack_68._M_dataplus._M_p,sStack_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bStack_e0._M_dataplus._M_p != &bStack_e0.field_2) {
      operator_delete(bStack_e0._M_dataplus._M_p,bStack_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_c0._M_dataplus._M_p != &sStack_c0.field_2) {
      operator_delete(sStack_c0._M_dataplus._M_p,sStack_c0.field_2._M_allocated_capacity + 1);
    }
    *(long *)((Printer *)this + 0x68) =
         *(long *)((Printer *)this + 0x68) + *(long *)((Printer *)this + 0x58);
    sStack_c0._M_dataplus._M_p =
         absl::lts_20240722::container_internal::
         btree<absl::lts_20240722::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
         ::EmptyNode()::empty_node;
    sStack_c0._M_string_length =
         (size_type)
         absl::lts_20240722::container_internal::
         btree<absl::lts_20240722::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
         ::EmptyNode()::empty_node;
    sStack_c0.field_2._M_allocated_capacity = 0;
    pFStack_70 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
                 (puVar17 + 0x20);
    iVar18 = 0;
    do {
      if (*(int *)(*(Descriptor **)(puVar17 + 8) + 4) <= index_02) break;
      pFVar11 = Descriptor::field(*(Descriptor **)(puVar17 + 8),index_02);
      pIVar12 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                          (pFStack_70,pFVar11);
      iVar7 = (*(pIVar12->super_FieldGenerator)._vptr_FieldGenerator[7])(pIVar12);
      pFVar11 = Descriptor::field(*(Descriptor **)(puVar17 + 8),index_02);
      bVar15 = IsRealOneof(pFVar11);
      if (!bVar15) {
        pFVar11 = Descriptor::field(*(Descriptor **)(puVar17 + 8),index_02);
        bVar15 = BitfieldTracksMutability(pFVar11);
        if (!bVar15) {
          iVar8 = (*(pIVar12->super_FieldGenerator)._vptr_FieldGenerator[7])(pIVar12);
          if (iVar8 != 0) {
            iVar8 = (*(pIVar12->super_FieldGenerator)._vptr_FieldGenerator[6])(pIVar12);
            if (0 < iVar8) {
              iVar9 = (*(pIVar12->super_FieldGenerator)._vptr_FieldGenerator[4])(pIVar12);
              iVar8 = iVar9 + 0x1f;
              if (-1 < iVar9) {
                iVar8 = iVar9;
              }
              bStack_e0._M_dataplus._M_p._0_4_ = iVar8 >> 5;
              sVar13 = absl::lts_20240722::container_internal::
                       btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                       ::count<int>((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                                     *)&sStack_c0,(key_arg<int> *)&bStack_e0);
              if (sVar13 == 0) {
                GetBitFieldName_abi_cxx11_
                          (&sStack_a0,(java *)((ulong)bStack_e0._M_dataplus._M_p & 0xffffffff),
                           index_00);
                text_00._M_str = "int to_$bit_field_name$ = 0;\n";
                text_00._M_len = 0x1d;
                io::Printer::Print<char[15],std::__cxx11::string>
                          ((Printer *)this,text_00,(char (*) [15])"bit_field_name",&sStack_a0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sStack_a0._M_dataplus._M_p != &sStack_a0.field_2) {
                  operator_delete(sStack_a0._M_dataplus._M_p,
                                  sStack_a0.field_2._M_allocated_capacity + 1);
                }
                absl::lts_20240722::container_internal::
                btree<absl::lts_20240722::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                ::insert_unique<int,int_const&>
                          ((pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_bool>
                            *)&sStack_a0,
                           (btree<absl::lts_20240722::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                            *)&sStack_c0,(int *)&bStack_e0,(int *)&bStack_e0);
              }
            }
            (*(pIVar12->super_FieldGenerator)._vptr_FieldGenerator[0xe])(pIVar12,this);
          }
        }
      }
      iVar18 = iVar18 + iVar7;
      index_02 = index_02 + 1;
    } while (iVar18 < 0x20);
    iVar19 = absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
             ::begin((btree<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                      *)&sStack_c0);
    sVar4 = sStack_c0._M_string_length;
    bStack_e0._M_dataplus._M_p = (pointer)iVar19.node_;
    bStack_e0._M_string_length._0_4_ = iVar19.position_;
    if ((sStack_c0._M_string_length & 7) == 0) {
      uVar3 = *(undefined1 *)(sStack_c0._M_string_length + 10);
      while( true ) {
        other.position_._0_1_ = uVar3;
        other.node_ = (btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                       *)sVar4;
        other._9_7_ = 0;
        bVar15 = absl::lts_20240722::container_internal::
                 btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                 ::Equals((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                           *)&bStack_e0,other);
        if (bVar15) break;
        puVar14 = (uint *)absl::lts_20240722::container_internal::
                          btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                          ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                                       *)&bStack_e0);
        GetBitFieldName_abi_cxx11_(&sStack_a0,(java *)(ulong)*puVar14,index_01);
        text_01._M_str = "result.$bit_field_name$ |= to_$bit_field_name$;\n";
        text_01._M_len = 0x30;
        io::Printer::Print<char[15],std::__cxx11::string>
                  ((Printer *)this,text_01,(char (*) [15])"bit_field_name",&sStack_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_a0._M_dataplus._M_p != &sStack_a0.field_2) {
          operator_delete(sStack_a0._M_dataplus._M_p,sStack_a0.field_2._M_allocated_capacity + 1);
        }
        absl::lts_20240722::container_internal::
        btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
        ::increment((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                     *)&bStack_e0);
      }
      google::protobuf::io::Printer::Outdent();
      text_02._M_str = "}\n\n";
      text_02._M_len = 3;
      io::Printer::Print<>((Printer *)this,text_02);
      absl::lts_20240722::container_internal::
      btree<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
      ::~btree((btree<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                *)&sStack_c0);
      return SUB41(index_02,0);
    }
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned int, unsigned char, int, absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 61, 62>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned int, unsigned char, int, absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 61, 62>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
                 );
  }
  if (((byte)descriptor[1] & 0x20) != 0) {
    if (descriptor[2] == (FieldDescriptor)0xb) {
      cVar5 = google::protobuf::FieldDescriptor::is_map_message_type();
      if (cVar5 != '\0') goto LAB_00273844;
    }
    if ((byte)descriptor[2] < 0xf) {
      bVar6 = (byte)(0x4c00 >> ((byte)descriptor[2] & 0x1f));
      goto LAB_00273846;
    }
  }
LAB_00273844:
  bVar6 = 0;
LAB_00273846:
  return (bool)(bVar6 & 1);
}

Assistant:

bool BitfieldTracksMutability(const FieldDescriptor* const descriptor) {
  if (!descriptor->is_repeated() || IsMapField(descriptor)) {
    return false;
  }
  // TODO: update this to migrate repeated fields to use
  // ProtobufList (which tracks immutability internally). That allows us to use
  // the presence bit to skip work on the repeated field if it is not populated.
  // Once all repeated fields are held in ProtobufLists, this method shouldn't
  // be needed.
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_ENUM:
      return true;
    default:
      return false;
  }
}